

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O0

void __thiscall
gmath::RadialDistortion::invTransform
          (RadialDistortion *this,double *xd,double *yd,double xx,double yy)

{
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  double dtmp [16];
  long ltmp [2];
  double fvec [2];
  long *in_stack_000000b0;
  RadialDistortionParameter param;
  double x [2];
  undefined1 local_108 [128];
  undefined1 local_88 [40];
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 *local_18;
  undefined8 *local_10;
  
  local_60 = *(undefined8 *)(in_RDI + 0x10);
  local_58 = *(undefined8 *)(in_RDI + 0x18);
  local_50 = *(undefined8 *)(in_RDI + 0x20);
  local_38 = in_XMM0_Qa;
  local_30 = in_XMM1_Qa;
  local_18 = in_RDX;
  local_10 = in_RSI;
  memset(local_88,0,0x10);
  memset(local_108,0,0x80);
  slmder((lmderFct)dtmp[0xc],dtmp[0xb]._4_4_,dtmp[0xb]._0_4_,(double *)dtmp[10],(double *)dtmp[9],
         (void *)dtmp[8],dtmp[7],in_stack_000000b0,(double *)param.kd[0]);
  *local_10 = local_38;
  *local_18 = local_30;
  return;
}

Assistant:

void RadialDistortion::invTransform(double &xd, double &yd, double xx, double yy) const
{
  double x[2]= {xx, yy};

  RadialDistortionParameter param;

  param.kd[0]=kd[0];
  param.kd[1]=kd[1];
  param.kd[2]=kd[2];
  param.xd=xx;
  param.yd=yy;

  double fvec[2];

  long ltmp[2]= {0, 0};
  double dtmp[16];

  memset(dtmp, 0, 16*sizeof(double));
  gmath::slmder(computeRadialDistortion, 2, 2, x, fvec, &param, 1e-6, ltmp, dtmp);

  xd=x[0];
  yd=x[1];
}